

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constrain.cpp
# Opt level: O3

void __thiscall CaDiCaL::Internal::constrain(Internal *this,int lit)

{
  char cVar1;
  uint uVar2;
  iterator __position;
  pointer pcVar3;
  int *piVar4;
  uint uVar5;
  bool bVar6;
  int *lit_1;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  char cVar10;
  iterator __begin4;
  int *piVar11;
  int local_24;
  
  if (lit == 0) {
    if (this->level != 0) {
      backtrack(this,0);
    }
    puVar8 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    puVar7 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    puVar9 = puVar8;
    if (puVar8 == puVar7) {
      bVar6 = true;
      puVar9 = puVar7;
    }
    else {
      do {
        uVar2 = *puVar8;
        uVar5 = -uVar2;
        if (0 < (int)uVar2) {
          uVar5 = uVar2;
        }
        pcVar3 = (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
        cVar1 = pcVar3[uVar5];
        cVar10 = -cVar1;
        if (-1 < (long)(int)uVar2) {
          cVar10 = cVar1;
        }
        if (cVar10 < '\x01') {
          if (cVar10 < '\0') {
LAB_007f7278:
            bVar6 = false;
            goto LAB_007f727a;
          }
          if (-1 < this->vals[(int)uVar2]) {
            if (this->vals[(int)uVar2] != '\0') goto LAB_007f7278;
            *puVar9 = uVar2;
            puVar9 = puVar9 + 1;
            uVar2 = *puVar8;
            uVar5 = -uVar2;
            if (0 < (int)uVar2) {
              uVar5 = uVar2;
            }
            pcVar3[uVar5] = uVar2 != 0 | (byte)((int)uVar2 >> 0x1f);
          }
        }
        puVar8 = puVar8 + 1;
      } while (puVar8 != puVar7);
      bVar6 = true;
LAB_007f727a:
      puVar7 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&this->constraint,(long)puVar9 - (long)puVar7 >> 2);
    puVar7 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar8 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start; puVar8 != puVar7; puVar8 = puVar8 + 1) {
      uVar2 = *puVar8;
      uVar5 = -uVar2;
      if (0 < (int)uVar2) {
        uVar5 = uVar2;
      }
      (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = '\0';
    }
    piVar11 = (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar4 = (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (bVar6) {
      if (piVar11 == piVar4) {
        this->unsat_constraint = true;
        if (this->conflict_id == 0) {
          this->marked_failed = false;
        }
      }
      else {
        do {
          freeze(this,*piVar11);
          piVar11 = piVar11 + 1;
        } while (piVar11 != piVar4);
      }
    }
    else if (piVar4 != piVar11) {
      (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar11;
    }
  }
  else {
    __position._M_current =
         (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->constraint,__position,&local_24);
    }
    else {
      *__position._M_current = lit;
      (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void Internal::constrain (int lit) {
  if (lit)
    constraint.push_back (lit);
  else {
    if (level)
      backtrack ();
    LOG (constraint, "shrinking constraint");
    bool satisfied_constraint = false;
    const vector<int>::const_iterator end = constraint.end ();
    vector<int>::iterator i = constraint.begin ();
    for (vector<int>::const_iterator j = i; j != end; j++) {
      int tmp = marked (*j);
      if (tmp > 0) {
        LOG ("removing duplicated literal %d from constraint", *j);
      } else if (tmp < 0) {
        LOG ("tautological since both %d and %d occur in constraint", -*j,
             *j);
        satisfied_constraint = true;
        break;
      } else {
        tmp = val (*j);
        if (tmp < 0) {
          LOG ("removing falsified literal %d from constraint clause", *j);
        } else if (tmp > 0) {
          LOG ("satisfied constraint with literal %d", *j);
          satisfied_constraint = true;
          break;
        } else {
          *i++ = *j;
          mark (*j);
        }
      }
    }
    constraint.resize (i - constraint.begin ());
    for (const auto &lit : constraint)
      unmark (lit);
    if (satisfied_constraint)
      constraint.clear ();
    else if (constraint.empty ()) {
      unsat_constraint = true;
      if (!conflict_id)
        marked_failed = false; // allow to trigger failing ()
    } else
      for (const auto lit : constraint)
        freeze (lit);
  }
}